

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::onTimeSyncSendTimer(Connection *this)

{
  uint uVar1;
  Result result;
  uint8_t buffer [11];
  ReceiverStatistics local_20;
  
  buffer._0_3_ = (int3)(int)(this->Incoming).AntiReplay.LargestSequence.Value + 1;
  uVar1 = (this->TimeSync).WindowedMinTS24Deltas.Samples[0].Value.Value;
  buffer[3] = (uint8_t)uVar1;
  buffer._4_3_ = (undefined3)(uVar1 >> 8);
  local_20 = ReceiverBandwidthControl::GetStatistics(&this->ReceiverControl);
  ReceiverStatistics::Compress(&local_20,buffer + 6);
  SessionOutgoing::QueueUnreliable
            ((SessionOutgoing *)&result,(int)this + 0x168,(uint8_t *)0x0,(size_t)buffer);
  if (result.Error != (ErrorResult *)0x0) {
    RefCounter::StartShutdown
              (&(this->super_IConnection).SelfRefCount,(uint)(result.Error)->Code,&result);
  }
  Result::~Result(&result);
  return;
}

Assistant:

void Connection::onTimeSyncSendTimer()
{
    uint8_t buffer[kTimeSyncMessageBytes];

    // Write next expected nonce
    siamese::WriteU24_LE_Min4Bytes(buffer, Incoming.GetNextExpectedNonce24());

    // Write MinDeltaTS24
    siamese::WriteU24_LE_Min4Bytes(buffer + 3, TimeSync.GetMinDeltaTS24().ToUnsigned());

    // Write ReceiverStatistics
    const ReceiverStatistics stats = ReceiverControl.GetStatistics();
    stats.Compress(buffer + 3 + 3);

    Result result = Outgoing.QueueUnreliable(
        protocol::MessageType_TimeSync,
        buffer,
        kTimeSyncMessageBytes);

    if (result.IsFail()) {
        SelfRefCount.StartShutdown((unsigned)result.GetErrorCode(), result);
    }
}